

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O1

void crypto::xchacha20::init_state(word *state,char *key)

{
  size_t i;
  long lVar1;
  
  *(undefined8 *)state = 0x3320646e61707865;
  *(undefined8 *)(state + 2) = 0x6b20657479622d32;
  lVar1 = 0;
  do {
    state[lVar1 + 4] = *(word *)(key + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

void xchacha20::init_state(word state[16], const char key[key_size]) {
	
	state[0] = 0x61707865;
	state[1] = 0x3320646e;
	state[2] = 0x79622d32;
	state[3] = 0x6b206574;
	for(size_t i = 0; i < 8; i++) {
		state[4 + i] = util::little_endian::load<word>(key + i * sizeof(word));
	}
	
}